

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O3

Array * __thiscall
spvtools::opt::InstrumentPass::GetArray(InstrumentPass *this,Type *element,uint32_t length)

{
  IRContext *pIVar1;
  int iVar2;
  Type *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Array r;
  LengthInfo local_90;
  Array local_70;
  
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(pIVar1);
  }
  local_90.id = analysis::ConstantManager::GetUIntConstId
                          ((pIVar1->constant_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>
                           ._M_head_impl,length);
  local_90.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_90.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_90.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start + 2;
  *(ulong *)local_90.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (ulong)length << 0x20;
  local_90.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_90.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  analysis::Array::Array(&local_70,element,&local_90);
  pIVar1 = (this->super_Pass).context_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  pTVar3 = analysis::TypeManager::GetRegisteredType
                     ((pIVar1->type_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                      _M_head_impl,&local_70.super_Type);
  if (pTVar3 != (Type *)0x0) {
    iVar2 = (*pTVar3->_vptr_Type[0x17])(pTVar3);
    if (CONCAT44(extraout_var,iVar2) != 0) {
      iVar2 = (*pTVar3->_vptr_Type[0x17])(pTVar3);
      local_70.super_Type._vptr_Type = (_func_int **)&PTR__Array_003daa98;
      if (local_70.length_info_.words.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.length_info_.words.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_70.length_info_.words.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.length_info_.words.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_70.super_Type._vptr_Type = (_func_int **)&PTR__Type_003d7f68;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_70.super_Type.decorations_);
      if (local_90.words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.words.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.words.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.words.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return (Array *)CONCAT44(extraout_var_00,iVar2);
    }
  }
  __assert_fail("type && type->AsArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                ,0x19f,
                "analysis::Array *spvtools::opt::InstrumentPass::GetArray(const analysis::Type *, uint32_t)"
               );
}

Assistant:

analysis::Array* InstrumentPass::GetArray(const analysis::Type* element,
                                          uint32_t length) {
  uint32_t length_id = context()->get_constant_mgr()->GetUIntConstId(length);
  analysis::Array::LengthInfo length_info{
      length_id, {analysis::Array::LengthInfo::Case::kConstant, length}};

  analysis::Array r(element, length_info);

  analysis::Type* type = context()->get_type_mgr()->GetRegisteredType(&r);
  assert(type && type->AsArray());
  return type->AsArray();
}